

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlParseSGMLCatalogName(xmlChar *cur,xmlChar **name)

{
  xmlChar *pxVar1;
  int iVar2;
  bool bVar3;
  uint local_a0;
  int local_9c;
  int c;
  int len;
  xmlChar buf [105];
  xmlChar **name_local;
  xmlChar *cur_local;
  
  local_9c = 0;
  *name = (xmlChar *)0x0;
  local_a0 = (uint)*cur;
  name_local = (xmlChar **)cur;
  if (local_a0 < 0x100) {
    if (((((0x40 < local_a0) && (local_a0 < 0x5b)) || ((0x60 < local_a0 && (local_a0 < 0x7b)))) ||
        ((0xbf < local_a0 && (local_a0 < 0xd7)))) ||
       (((0xd7 < local_a0 && (local_a0 < 0xf7)) || (0xf7 < local_a0)))) goto LAB_0013fce0;
  }
  else {
    iVar2 = xmlCharInRange(local_a0,&xmlIsBaseCharGroup);
    if (iVar2 != 0) goto LAB_0013fce0;
  }
  if (((local_a0 < 0x100) ||
      ((((local_a0 < 0x4e00 || (0x9fa5 < local_a0)) && (local_a0 != 0x3007)) &&
       ((local_a0 < 0x3021 || (0x3029 < local_a0)))))) && ((local_a0 != 0x5f && (local_a0 != 0x3a)))
     ) {
    return (xmlChar *)0x0;
  }
LAB_0013fce0:
  do {
    if (local_a0 < 0x100) {
      if (((((local_a0 < 0x41) || (bVar3 = true, 0x5a < local_a0)) &&
           ((local_a0 < 0x61 || (bVar3 = true, 0x7a < local_a0)))) &&
          (((local_a0 < 0xc0 || (bVar3 = true, 0xd6 < local_a0)) &&
           ((local_a0 < 0xd8 || (bVar3 = true, 0xf6 < local_a0)))))) &&
         (bVar3 = true, local_a0 < 0xf8)) {
LAB_0013fdbe:
        if ((local_a0 < 0x100) ||
           ((((local_a0 < 0x4e00 || (bVar3 = true, 0x9fa5 < local_a0)) &&
             (bVar3 = true, local_a0 != 0x3007)) &&
            ((local_a0 < 0x3021 || (bVar3 = true, 0x3029 < local_a0)))))) {
          if (local_a0 < 0x100) {
            if ((local_a0 < 0x30) || (bVar3 = true, 0x39 < local_a0)) {
LAB_0013fe8e:
              bVar3 = true;
              if ((local_a0 != 0x2e) &&
                 ((bVar3 = true, local_a0 != 0x2d && (bVar3 = true, local_a0 != 0x5f)))) {
                bVar3 = local_a0 == 0x3a;
              }
            }
          }
          else {
            iVar2 = xmlCharInRange(local_a0,&xmlIsDigitGroup);
            bVar3 = true;
            if (iVar2 == 0) goto LAB_0013fe8e;
          }
        }
      }
    }
    else {
      iVar2 = xmlCharInRange(local_a0,&xmlIsBaseCharGroup);
      bVar3 = true;
      if (iVar2 == 0) goto LAB_0013fdbe;
    }
    if (!bVar3) {
      pxVar1 = xmlStrndup((xmlChar *)&c,local_9c);
      *name = pxVar1;
      return (xmlChar *)name_local;
    }
    iVar2 = local_9c + 1;
    *(char *)((long)&c + (long)local_9c) = (char)local_a0;
    name_local = (xmlChar **)((long)name_local + 1);
    local_a0 = (uint)*(byte *)name_local;
    local_9c = iVar2;
    if (99 < iVar2) {
      return (xmlChar *)0x0;
    }
  } while( true );
}

Assistant:

static const xmlChar *
xmlParseSGMLCatalogName(const xmlChar *cur, xmlChar **name) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    int len = 0;
    int c;

    *name = NULL;

    /*
     * Handler for more complex cases
     */
    c = *cur;
    if ((!IS_LETTER(c) && (c != '_') && (c != ':'))) {
	return(NULL);
    }

    while (((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || (c == ':'))) {
	buf[len++] = c;
	cur++;
	c = *cur;
	if (len >= XML_MAX_NAMELEN)
	    return(NULL);
    }
    *name = xmlStrndup(buf, len);
    return(cur);
}